

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O0

void smf_track_add_event(smf_track_t *track,smf_event_t *event)

{
  int iVar1;
  smf_event_t *psVar2;
  smf_event_t *psVar3;
  smf_event_t *next_event;
  smf_event_t *tmp;
  int last_pulses;
  int i;
  smf_event_t *event_local;
  smf_track_t *track_local;
  
  tmp._0_4_ = 0;
  if (track->smf == (smf_t *)0x0) {
    __assert_fail("track->smf != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1b8,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->track != (smf_track_t *)0x0) {
    __assert_fail("event->track == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1b9,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->delta_time_pulses != -1) {
    __assert_fail("event->delta_time_pulses == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1ba,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->time_pulses < 0) {
    __assert_fail("event->time_pulses >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1bb,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  if (event->time_seconds < 0.0) {
    __assert_fail("event->time_seconds >= 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                  ,0x1bc,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
  }
  remove_eot_if_before_pulses(track,event->time_pulses);
  event->track = track;
  event->track_number = track->track_number;
  if (track->number_of_events == 0) {
    if (track->next_event_number != -1) {
      __assert_fail("track->next_event_number == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x1c4,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
    }
    track->next_event_number = 1;
  }
  if (0 < track->number_of_events) {
    psVar2 = smf_track_get_last_event(track);
    tmp._0_4_ = psVar2->time_pulses;
  }
  track->number_of_events = track->number_of_events + 1;
  if (event->time_pulses < (int)tmp) {
    g_ptr_array_add(track->events_array,event);
    g_ptr_array_sort(track->events_array,events_array_compare_function);
    for (tmp._4_4_ = 1; tmp._4_4_ <= track->number_of_events; tmp._4_4_ = tmp._4_4_ + 1) {
      psVar2 = smf_track_get_event_by_number(track,tmp._4_4_);
      psVar2->event_number = tmp._4_4_;
      if (psVar2->delta_time_pulses == -1) {
        if (tmp._4_4_ == 1) {
          psVar2->delta_time_pulses = psVar2->time_pulses;
        }
        else {
          iVar1 = psVar2->time_pulses;
          psVar3 = smf_track_get_event_by_number(track,tmp._4_4_ + -1);
          psVar2->delta_time_pulses = iVar1 - psVar3->time_pulses;
          if (psVar2->delta_time_pulses < 0) {
            __assert_fail("tmp->delta_time_pulses >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                          ,0x1e7,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
          }
        }
      }
    }
    if (event->event_number < track->number_of_events) {
      psVar2 = smf_track_get_event_by_number(track,event->event_number + 1);
      if (psVar2 == (smf_event_t *)0x0) {
        __assert_fail("next_event",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1ee,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
      if (psVar2->time_pulses < event->time_pulses) {
        __assert_fail("next_event->time_pulses >= event->time_pulses",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1ef,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
      psVar2->delta_time_pulses = psVar2->delta_time_pulses - event->delta_time_pulses;
      if (psVar2->delta_time_pulses < 0) {
        __assert_fail("next_event->delta_time_pulses >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                      ,0x1f1,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
      }
    }
  }
  else {
    event->delta_time_pulses = event->time_pulses - (int)tmp;
    if (event->delta_time_pulses < 0) {
      __assert_fail("event->delta_time_pulses >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                    ,0x1d0,"void smf_track_add_event(smf_track_t *, smf_event_t *)");
    }
    g_ptr_array_add(track->events_array,event);
    event->event_number = track->number_of_events;
  }
  iVar1 = smf_event_is_tempo_change_or_time_signature(event);
  if (iVar1 != 0) {
    iVar1 = smf_event_is_last(event);
    if (iVar1 == 0) {
      smf_create_tempo_map_and_compute_seconds(event->track->smf);
    }
    else {
      maybe_add_to_tempo_map(event);
    }
  }
  return;
}

Assistant:

void
smf_track_add_event(smf_track_t *track, smf_event_t *event)
{
	int i, last_pulses = 0;

	assert(track->smf != NULL);
	assert(event->track == NULL);
	assert(event->delta_time_pulses == -1);
	assert(event->time_pulses >= 0);
	assert(event->time_seconds >= 0.0);

	remove_eot_if_before_pulses(track, event->time_pulses);

	event->track = track;
	event->track_number = track->track_number;

	if (track->number_of_events == 0) {
		assert(track->next_event_number == -1);
		track->next_event_number = 1;
	}

	if (track->number_of_events > 0)
		last_pulses = smf_track_get_last_event(track)->time_pulses;

	track->number_of_events++;

	/* Are we just appending element at the end of the track? */
	if (last_pulses <= event->time_pulses) {
		event->delta_time_pulses = event->time_pulses - last_pulses;
		assert(event->delta_time_pulses >= 0);
		g_ptr_array_add(track->events_array, event);
		event->event_number = track->number_of_events;

	/* We need to insert in the middle of the track.  XXX: This is slow. */
	} else {
		/* Append, then sort according to ->time_pulses. */
		g_ptr_array_add(track->events_array, event);
		g_ptr_array_sort(track->events_array, events_array_compare_function);

		/* Renumber entries and fix their ->delta_pulses. */
		for (i = 1; i <= track->number_of_events; i++) {
			smf_event_t *tmp = smf_track_get_event_by_number(track, i);
			tmp->event_number = i;

			if (tmp->delta_time_pulses != -1)
				continue;

			if (i == 1) {
				tmp->delta_time_pulses = tmp->time_pulses;
			} else {
				tmp->delta_time_pulses = tmp->time_pulses -
					smf_track_get_event_by_number(track, i - 1)->time_pulses;
				assert(tmp->delta_time_pulses >= 0);
			}
		}

		/* Adjust ->delta_time_pulses of the next event. */
		if (event->event_number < track->number_of_events) {
			smf_event_t *next_event = smf_track_get_event_by_number(track, event->event_number + 1);
			assert(next_event);
			assert(next_event->time_pulses >= event->time_pulses);
			next_event->delta_time_pulses -= event->delta_time_pulses;
			assert(next_event->delta_time_pulses >= 0);
		}
	}

	if (smf_event_is_tempo_change_or_time_signature(event)) {
		if (smf_event_is_last(event))
			maybe_add_to_tempo_map(event);
		else
			smf_create_tempo_map_and_compute_seconds(event->track->smf);
	}
}